

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

int uv__stream_recv_cmsg(uv_stream_t *stream,msghdr *msg)

{
  int iVar1;
  char *local_60;
  uint local_58;
  uint local_54;
  uint count;
  uint i;
  int *pi;
  void *pv;
  int err;
  char *end;
  char *start;
  cmsghdr *cmsg;
  msghdr *msg_local;
  uv_stream_t *stream_local;
  
  if (msg->msg_controllen < 0x10) {
    local_60 = (char *)0x0;
  }
  else {
    local_60 = (char *)msg->msg_control;
  }
  start = local_60;
  do {
    if (start == (char *)0x0) {
      return 0;
    }
    if (*(int *)(start + 0xc) == 1) {
      local_58 = 0;
      while (start + (ulong)local_58 * 4 + 0x10 < start + *(long *)start) {
        local_58 = local_58 + 1;
      }
      if (start + (ulong)local_58 * 4 + 0x10 != start + *(long *)start) {
        __assert_fail("start + CMSG_LEN(count * sizeof(*pi)) == end",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x43b,"int uv__stream_recv_cmsg(uv_stream_t *, struct msghdr *)");
      }
      for (local_54 = 0; local_54 < local_58; local_54 = local_54 + 1) {
        if (stream->accepted_fd == -1) {
          stream->accepted_fd = *(int *)(start + (ulong)local_54 * 4 + 0x10);
        }
        else {
          iVar1 = uv__stream_queue_fd(stream,*(int *)(start + (ulong)local_54 * 4 + 0x10));
          if (iVar1 != 0) {
            for (; local_54 < local_58; local_54 = local_54 + 1) {
              uv__close(*(int *)(start + (ulong)local_54 * 4 + 0x10));
            }
            return iVar1;
          }
        }
      }
    }
    else {
      fprintf(_stderr,"ignoring non-SCM_RIGHTS ancillary data: %d\n",(ulong)*(uint *)(start + 0xc));
    }
    start = (char *)__cmsg_nxthdr((msghdr *)msg,(cmsghdr *)start);
  } while( true );
}

Assistant:

static int uv__stream_recv_cmsg(uv_stream_t* stream, struct msghdr* msg) {
  struct cmsghdr* cmsg;

  for (cmsg = CMSG_FIRSTHDR(msg); cmsg != NULL; cmsg = CMSG_NXTHDR(msg, cmsg)) {
    char* start;
    char* end;
    int err;
    void* pv;
    int* pi;
    unsigned int i;
    unsigned int count;

    if (cmsg->cmsg_type != SCM_RIGHTS) {
      fprintf(stderr, "ignoring non-SCM_RIGHTS ancillary data: %d\n",
          cmsg->cmsg_type);
      continue;
    }

    /* silence aliasing warning */
    pv = CMSG_DATA(cmsg);
    pi = pv;

    /* Count available fds */
    start = (char*) cmsg;
    end = (char*) cmsg + cmsg->cmsg_len;
    count = 0;
    while (start + CMSG_LEN(count * sizeof(*pi)) < end)
      count++;
    assert(start + CMSG_LEN(count * sizeof(*pi)) == end);

    for (i = 0; i < count; i++) {
      /* Already has accepted fd, queue now */
      if (stream->accepted_fd != -1) {
        err = uv__stream_queue_fd(stream, pi[i]);
        if (err != 0) {
          /* Close rest */
          for (; i < count; i++)
            uv__close(pi[i]);
          return err;
        }
      } else {
        stream->accepted_fd = pi[i];
      }
    }
  }

  return 0;
}